

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tetrahedralized_Volume_3D.cpp
# Opt level: O3

T_Element * __thiscall
Nova::Tetrahedralized_Volume<float,_3>::Get_Element
          (T_Element *__return_storage_ptr__,Tetrahedralized_Volume<float,_3> *this,int id)

{
  pointer pVVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (-1 < id) {
    uVar6 = (ulong)(uint)id;
    pVVar1 = (this->super_Simplex_Mesh<4>).elements._data.
             super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(this->super_Simplex_Mesh<4>).elements._data.
                              super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4)) {
      uVar5 = (ulong)pVVar1[uVar6]._data._M_elems[0];
      lVar2 = (long)(this->super_Point_Cloud<float,_3>).points._data.
                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->super_Point_Cloud<float,_3>).points._data.
                     super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 2) * -0x5555555555555555;
      uVar8 = uVar5;
      if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
        uVar3 = (ulong)*(int *)((long)pVVar1[uVar6]._data._M_elems + 4);
        uVar8 = uVar3;
        if (((uVar3 <= uVar4 && uVar4 - uVar3 != 0) &&
            (uVar7 = (ulong)*(int *)((long)pVVar1[uVar6]._data._M_elems + 8), uVar8 = uVar7,
            uVar7 <= uVar4 && uVar4 - uVar7 != 0)) &&
           (uVar8 = (ulong)*(int *)((long)pVVar1[uVar6]._data._M_elems + 0xc),
           uVar8 <= uVar4 && uVar4 - uVar8 != 0)) {
          Tetrahedron<float>::Tetrahedron
                    (__return_storage_ptr__,(TV *)(lVar2 + uVar5 * 0xc),(TV *)(lVar2 + uVar3 * 0xc),
                     (TV *)(lVar2 + uVar7 * 0xc),(TV *)(lVar2 + uVar8 * 0xc));
          return __return_storage_ptr__;
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
    }
  }
  __assert_fail("id>=0 && id<elements.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/src/Topology_Based_Geometry/Tetrahedralized_Volume_3D.cpp"
                ,0x24,
                "typename Nova::Tetrahedralized_Volume_Policy<T, d>::T_Element Nova::Tetrahedralized_Volume<float, 3>::Get_Element(const int) const [T = float, d = 3]"
               );
}

Assistant:

typename Nova::Tetrahedralized_Volume_Policy<T,d>::T_Element Nova::Tetrahedralized_Volume<T,d>::
Get_Element(const int id) const
{
    assert(id>=0 && id<elements.size());
    const INDEX& e=elements(id);
    return T_Element(points(e(0)),points(e(1)),points(e(2)),points(e(3)));
}